

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

void __thiscall
icu_63::Normalizer2Impl::decomposeAndAppend
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool doDecompose,UnicodeString *safeMiddle
          ,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  UChar UVar1;
  UChar UVar2;
  ushort uVar3;
  UBool UVar4;
  int iVar5;
  bool bVar6;
  UCPTrie *trie;
  UChar *pUVar7;
  UChar *pUVar8;
  uint8_t leadCC;
  ushort uVar9;
  uint8_t trailCC;
  ushort uVar10;
  
  ReorderingBuffer::copyReorderableSuffixTo(buffer,safeMiddle);
  if (doDecompose != '\0') {
    decompose(this,src,limit,buffer,errorCode);
    return;
  }
  pUVar8 = src;
  if (src == limit) {
    leadCC = '\0';
    trailCC = '\0';
  }
  else {
    bVar6 = true;
    uVar9 = 0;
    uVar10 = 0;
    do {
      trailCC = (uint8_t)uVar10;
      leadCC = (uint8_t)uVar9;
      pUVar7 = pUVar8 + 1;
      UVar1 = *pUVar8;
      if ((UVar1 & 0xf800U) == 0xd800) {
        if ((pUVar7 == limit | (byte)((ushort)UVar1 >> 10) & 1) == 1) {
          trie = this->normTrie;
        }
        else {
          UVar2 = *pUVar7;
          trie = this->normTrie;
          if ((UVar2 & 0xfc00U) == 0xdc00) {
            pUVar7 = pUVar8 + 2;
            iVar5 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + -0x35fdc00;
            if (iVar5 < trie->highStart) {
              iVar5 = ucptrie_internalSmallIndex_63(trie,iVar5);
              trie = this->normTrie;
            }
            else {
              iVar5 = trie->dataLength + -2;
            }
            goto LAB_00294b16;
          }
        }
        iVar5 = trie->dataLength + -1;
      }
      else {
        trie = this->normTrie;
        iVar5 = ((ushort)UVar1 & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
      }
LAB_00294b16:
      uVar10 = *(ushort *)((long)(trie->data).ptr0 + (long)iVar5 * 2);
      if (uVar10 < 0xfc00) {
        if (((uVar10 < this->minNoNo) || (this->limitNoNo <= uVar10)) ||
           ((*(byte *)((long)this->extraData + (ulong)(uVar10 & 0xfffffffe)) & 0x80) == 0)) break;
        uVar10 = this->extraData[(ulong)(uVar10 >> 1) - 1];
      }
      else {
        uVar10 = uVar10 >> 1;
      }
      if ((uint8_t)uVar10 == '\0') break;
      uVar3 = uVar9;
      if (bVar6) {
        uVar3 = uVar10;
      }
      uVar9 = uVar3 & 0xff;
      leadCC = (uint8_t)uVar3;
      bVar6 = false;
      pUVar8 = pUVar7;
      trailCC = (uint8_t)uVar10;
    } while (pUVar7 != limit);
  }
  if (limit == (UChar *)0x0) {
    limit = u_strchr_63(pUVar8,L'\0');
  }
  UVar4 = ReorderingBuffer::append
                    (buffer,src,(int32_t)((ulong)((long)pUVar8 - (long)src) >> 1),'\0',leadCC,
                     trailCC,errorCode);
  if (UVar4 == '\0') {
    return;
  }
  ReorderingBuffer::appendZeroCC(buffer,pUVar8,limit,errorCode);
  return;
}

Assistant:

void Normalizer2Impl::decomposeAndAppend(const UChar *src, const UChar *limit,
                                         UBool doDecompose,
                                         UnicodeString &safeMiddle,
                                         ReorderingBuffer &buffer,
                                         UErrorCode &errorCode) const {
    buffer.copyReorderableSuffixTo(safeMiddle);
    if(doDecompose) {
        decompose(src, limit, &buffer, errorCode);
        return;
    }
    // Just merge the strings at the boundary.
    bool isFirst = true;
    uint8_t firstCC = 0, prevCC = 0, cc;
    const UChar *p = src;
    while (p != limit) {
        const UChar *codePointStart = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        if ((cc = getCC(norm16)) == 0) {
            p = codePointStart;
            break;
        }
        if (isFirst) {
            firstCC = cc;
            isFirst = false;
        }
        prevCC = cc;
    }
    if(limit==NULL) {  // appendZeroCC() needs limit!=NULL
        limit=u_strchr(p, 0);
    }

    if (buffer.append(src, (int32_t)(p - src), FALSE, firstCC, prevCC, errorCode)) {
        buffer.appendZeroCC(p, limit, errorCode);
    }
}